

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_thread.c
# Opt level: O2

int reset(AVxWorker *worker)

{
  int iVar1;
  int extraout_EAX;
  pthread_mutex_t *__mutex;
  size_t stacksize;
  pthread_attr_t attr;
  
  worker->had_error = 0;
  if (worker->status_ == AVX_WORKER_STATUS_OK) {
    return 1;
  }
  if (worker->status_ == AVX_WORKER_STATUS_NOT_OK) {
    __mutex = (pthread_mutex_t *)aom_calloc(1,0x60);
    worker->impl_ = (AVxWorkerImpl *)__mutex;
    if (__mutex == (pthread_mutex_t *)0x0) {
      return 0;
    }
    iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      iVar1 = pthread_cond_init((pthread_cond_t *)&worker->impl_->condition_,
                                (pthread_condattr_t *)0x0);
      if (iVar1 == 0) {
        iVar1 = pthread_attr_init((pthread_attr_t *)&attr);
        if (iVar1 == 0) {
          iVar1 = pthread_attr_getstacksize((pthread_attr_t *)&attr,&stacksize);
          if (((iVar1 != 0) || (0x3ffff < stacksize)) ||
             (iVar1 = pthread_attr_setstacksize((pthread_attr_t *)&attr,0x40000), iVar1 == 0)) {
            pthread_mutex_lock((pthread_mutex_t *)worker->impl_);
            iVar1 = pthread_create(&worker->impl_->thread_,(pthread_attr_t *)&attr,thread_loop,
                                   worker);
            if (iVar1 == 0) {
              worker->status_ = AVX_WORKER_STATUS_OK;
              pthread_mutex_unlock((pthread_mutex_t *)worker->impl_);
              pthread_attr_destroy((pthread_attr_t *)&attr);
              return 1;
            }
            pthread_mutex_unlock((pthread_mutex_t *)worker->impl_);
          }
          pthread_attr_destroy((pthread_attr_t *)&attr);
        }
        pthread_mutex_destroy((pthread_mutex_t *)worker->impl_);
        pthread_cond_destroy((pthread_cond_t *)&worker->impl_->condition_);
      }
      else {
        pthread_mutex_destroy((pthread_mutex_t *)worker->impl_);
      }
    }
    aom_free(worker->impl_);
    worker->impl_ = (AVxWorkerImpl *)0x0;
    return 0;
  }
  sync();
  return extraout_EAX;
}

Assistant:

static int reset(AVxWorker *const worker) {
  int ok = 1;
  worker->had_error = 0;
  if (worker->status_ < AVX_WORKER_STATUS_OK) {
#if CONFIG_MULTITHREAD
    worker->impl_ = (AVxWorkerImpl *)aom_calloc(1, sizeof(*worker->impl_));
    if (worker->impl_ == NULL) {
      return 0;
    }
    if (pthread_mutex_init(&worker->impl_->mutex_, NULL)) {
      goto Error;
    }
    if (pthread_cond_init(&worker->impl_->condition_, NULL)) {
      pthread_mutex_destroy(&worker->impl_->mutex_);
      goto Error;
    }
    pthread_attr_t attr;
    if (pthread_attr_init(&attr)) goto Error2;
      // Debug ASan builds require at least ~1MiB of stack; prevents
      // failures on macOS arm64 where the default is 512KiB.
      // See: https://crbug.com/aomedia/3379
#if defined(AOM_ADDRESS_SANITIZER) && defined(__APPLE__) && AOM_ARCH_ARM && \
    !defined(NDEBUG)
    const size_t kMinStackSize = 1024 * 1024;
#else
    const size_t kMinStackSize = 256 * 1024;
#endif
    size_t stacksize;
    if (!pthread_attr_getstacksize(&attr, &stacksize)) {
      if (stacksize < kMinStackSize &&
          pthread_attr_setstacksize(&attr, kMinStackSize)) {
        pthread_attr_destroy(&attr);
        goto Error2;
      }
    }
    pthread_mutex_lock(&worker->impl_->mutex_);
    ok = !pthread_create(&worker->impl_->thread_, &attr, thread_loop, worker);
    if (ok) worker->status_ = AVX_WORKER_STATUS_OK;
    pthread_mutex_unlock(&worker->impl_->mutex_);
    pthread_attr_destroy(&attr);
    if (!ok) {
    Error2:
      pthread_mutex_destroy(&worker->impl_->mutex_);
      pthread_cond_destroy(&worker->impl_->condition_);
    Error:
      aom_free(worker->impl_);
      worker->impl_ = NULL;
      return 0;
    }
#else
    worker->status_ = AVX_WORKER_STATUS_OK;
#endif
  } else if (worker->status_ > AVX_WORKER_STATUS_OK) {
    ok = sync(worker);
  }
  assert(!ok || (worker->status_ == AVX_WORKER_STATUS_OK));
  return ok;
}